

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalFederateId.hpp
# Opt level: O3

const_iterator __thiscall
CLI::std::
_Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::route_id>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
::find(_Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::route_id>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *this,key_type *__k)

{
  anon_struct_4_0_00000001_for___align aVar1;
  anon_struct_4_0_00000001_for___align aVar2;
  ulong uVar3;
  _Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false> _Var4;
  
  aVar1 = (anon_struct_4_0_00000001_for___align)__k->gid;
  _Var4._M_cur = (__node_type *)0x0;
  uVar3 = (ulong)(long)(int)aVar1 % this->_M_bucket_count;
  if ((this->_M_buckets[uVar3] != (__node_base_ptr)0x0) &&
     (_Var4._M_cur = (__node_type *)this->_M_buckets[uVar3]->_M_nxt,
     aVar1 != ((_Var4._M_cur)->
              super__Hash_node_value<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
              ).
              super__Hash_node_value_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>
              ._M_storage._M_storage.__align)) {
    while (_Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt,
          _Var4._M_cur != (__node_type *)0x0) {
      aVar2 = ((_Var4._M_cur)->
              super__Hash_node_value<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
              ).
              super__Hash_node_value_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>
              ._M_storage._M_storage.__align;
      if ((ulong)(long)(int)aVar2 % this->_M_bucket_count != uVar3) {
        return (const_iterator)(__node_type *)0x0;
      }
      if (aVar1 == aVar2) {
        return (const_iterator)
               (_Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
                )_Var4._M_cur;
      }
    }
    _Var4._M_cur = (__node_type *)0x0;
  }
  return (const_iterator)
         (_Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>)
         _Var4._M_cur;
}

Assistant:

constexpr bool operator==(GlobalFederateId id) const noexcept { return (gid == id.gid); }